

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmsg.c
# Opt level: O2

LispPTR mess_read(LispPTR *args)

{
  return 0;
}

Assistant:

LispPTR mess_read(LispPTR *args)
/* args[0]		buffer	*/
{
#ifdef MAIKO_HANDLE_CONSOLE_MESSAGES
  struct stat sbuf;
  int size, save_size;
  char *base;
  LispPTR *naddress;
  int i;
  static char temp_buf[MESSAGE_BUFFER_SIZE];

  SETJMP(NIL);

  /* Get buff address from LISP */
  naddress = (LispPTR *)(NativeAligned4FromLAddr(args[0]));
  base = (char *)(NativeAligned2FromLAddr(((OneDArray *)naddress)->base));

  close(log_id);
  TIMEOUT(log_id = open(logfile, O_RDONLY));
  if (log_id == -1) return (NIL);
  TIMEOUT(i = fstat(log_id, &sbuf));
  if (i != 0) {
    OSMESSAGE_PRINT(printf("stat err\n"));
    return (NIL);
  }
  save_size = (int)(sbuf.st_size);
  size = save_size - previous_size;
  if (size > MESSAGE_BUFFER_SIZE)
    size = MESSAGE_BUFFER_SIZE;
  else
    logChanged = 0; /* only reset msg-pending flag if we cleaned it out! */
  TIMEOUT(i = lseek(log_id, previous_size, SEEK_SET));
  if (i == -1) {
    OSMESSAGE_PRINT(printf("seek err\n"));
    return (NIL);
  }

  /* Now, read "console output" */
  TIMEOUT(size = read(log_id, temp_buf, size));
  if (size == -1) {
    OSMESSAGE_PRINT(printf("read err\n"));
    return (NIL);
  }
  TIMEOUT(i = lseek(log_id, save_size, SEEK_SET));
  if (i == -1) {
    OSMESSAGE_PRINT(printf("seek err\n"));
    return (NIL);
  }
  /*
      TIMEOUT( close(id) );
  */
  previous_size += size;

  for (i = 0; i < size; ++i) {
    if (temp_buf[i] == '\n') temp_buf[i] = '\000';
  }
  /* COPY actual Lisp Buffer(for BYTESWAP magic) */
  StrNCpyFromCToLisp(base, temp_buf, size);

  return (GetSmallp(size));
#else
  return (NIL);
#endif /* MAIKO_HANDLE_CONSOLE_MESSAGES */
}